

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O1

string * __thiscall
GdlRuleItem::PosString_abi_cxx11_(string *__return_storage_ptr__,GdlRuleItem *this)

{
  uint __val;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  string *__str;
  uint uVar4;
  uint __len;
  
  uVar4 = this->m_iritContextPosOrig + 1;
  __val = -uVar4;
  if (0 < (int)uVar4) {
    __val = uVar4;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_001441e6;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_001441e6;
      }
      if (uVar2 < 10000) goto LAB_001441e6;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_001441e6:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar4 >> 0x1f),__len,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string PosString()
	{
		return std::to_string(m_iritContextPosOrig + 1);
	}